

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_arena.h
# Opt level: O2

void __thiscall
ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::resize
          (ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name> *this,size_t size)

{
  undefined8 *puVar1;
  ulong uVar2;
  long lVar3;
  
  if (this->allocatedElements < size) {
    reallocate(this,size);
  }
  uVar2 = this->usedElements;
  lVar3 = uVar2 << 4;
  for (; uVar2 < size; uVar2 = uVar2 + 1) {
    puVar1 = (undefined8 *)((long)&(this->data->super_IString).str._M_len + lVar3);
    *puVar1 = 0;
    puVar1[1] = 0;
    lVar3 = lVar3 + 0x10;
  }
  this->usedElements = size;
  return;
}

Assistant:

void resize(size_t size) {
    if (size > allocatedElements) {
      reallocate(size);
    }
    // construct new elements
    for (size_t i = usedElements; i < size; i++) {
      new (data + i) T();
    }
    usedElements = size;
  }